

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mockaron.cpp
# Opt level: O0

void mockaron::detail::register_function_mock(void *n,any *h)

{
  size_type sVar1;
  mapped_type *this;
  any *h_local;
  void *n_local;
  
  h_local = (any *)n;
  sVar1 = std::
          unordered_map<const_void_*,_mockaron::detail::any,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>_>
          ::count((unordered_map<const_void_*,_mockaron::detail::any,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>_>
                   *)(anonymous_namespace)::function_mocks,&h_local);
  if (sVar1 != 0) {
    __assert_fail("!function_mocks.count(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/TankerHQ[P]mockaron/src/mockaron.cpp"
                  ,0x33,"void mockaron::detail::register_function_mock(const void *, any)");
  }
  this = std::
         unordered_map<const_void_*,_mockaron::detail::any,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>_>
         ::operator[]((unordered_map<const_void_*,_mockaron::detail::any,_std::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_mockaron::detail::any>_>_>
                       *)(anonymous_namespace)::function_mocks,&h_local);
  any::operator=(this,h);
  return;
}

Assistant:

void register_function_mock(void const* n, any h)
{
  assert(!function_mocks.count(n));
  function_mocks[n] = std::move(h);
}